

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::inheritStyle(QWidgetPrivate *this)

{
  QWidget *this_00;
  QWExtra *pQVar1;
  long lVar2;
  qsizetype qVar3;
  QStyleSheetStyle *pQVar4;
  QStyleSheetStyle *pQVar5;
  QStyleSheetStyle *pQVar6;
  QStyleSheetStyle *object;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (((pQVar1 == (QWExtra *)0x0) || (lVar2 = (long)(pQVar1->style).wp.d, lVar2 == 0)) ||
     (*(int *)(lVar2 + 4) == 0)) {
    pQVar6 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar6 = *(QStyleSheetStyle **)((long)&(pQVar1->style).wp + 8);
  }
  pQVar4 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>((QObject *)pQVar6);
  QWidget::styleSheet((QString *)&local_50,this_00);
  qVar3 = local_50.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (qVar3 != 0) {
    QStyleSheetStyle::repolish((QStyleSheetStyle *)pQVar4,this_00);
    goto LAB_002f4a75;
  }
  object = pQVar6;
  if (pQVar4 != (QStyleSheetStyle *)0x0) {
    object = (QStyleSheetStyle *)pQVar4->base;
  }
  lVar2 = *(long *)(*(long *)&this_00->field_0x8 + 0x10);
  if (((lVar2 == 0) || (lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x78), lVar2 == 0)) ||
     ((*(long *)(lVar2 + 0x20) == 0 || (*(int *)(*(long *)(lVar2 + 0x20) + 4) == 0)))) {
    pQVar4 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar4 = *(QStyleSheetStyle **)(lVar2 + 0x28);
  }
  QApplication::styleSheet((QString *)&local_50,QCoreApplication::self);
  if (local_50.size == 0) {
    pQVar5 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>((QObject *)pQVar4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (pQVar5 != (QStyleSheetStyle *)0x0) goto LAB_002f4a12;
    if (object == pQVar6) goto LAB_002f4a75;
    if ((*(uint *)(*(long *)&this_00->field_0x8 + 0x244) >> 0x16 & 1) == 0) {
      object = (QStyleSheetStyle *)0x0;
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
LAB_002f4a12:
    if (((*(byte *)(*(long *)&this_00->field_0x8 + 0x246) & 0x40) == 0) ||
       (pQVar6 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>((QObject *)object),
       pQVar6 != (QStyleSheetStyle *)0x0)) {
      object = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>((QObject *)object);
      if ((object == (QStyleSheetStyle *)0x0) &&
         (pQVar6 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>((QObject *)pQVar4),
         object = pQVar4, pQVar6 != (QStyleSheetStyle *)0x0)) {
        pQVar6->refcount = pQVar6->refcount + 1;
      }
    }
    else {
      pQVar6 = (QStyleSheetStyle *)operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle((QStyleSheetStyle *)pQVar6,(QStyle *)object);
      object = pQVar6;
    }
  }
  setStyle_helper(this,(QStyle *)object,true);
LAB_002f4a75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::inheritStyle()
{
#ifndef QT_NO_STYLE_STYLESHEET
    Q_Q(QWidget);

    QStyle *extraStyle = extra ? (QStyle*)extra->style : nullptr;

    QStyleSheetStyle *proxy = qt_styleSheet(extraStyle);

    if (!q->styleSheet().isEmpty()) {
        Q_ASSERT(proxy);
        proxy->repolish(q);
        return;
    }

    QStyle *origStyle = proxy ? proxy->base : extraStyle;
    QWidget *parent = q->parentWidget();
    QStyle *parentStyle = (parent && parent->d_func()->extra) ? (QStyle*)parent->d_func()->extra->style : nullptr;
    // If we have stylesheet on app or parent has stylesheet style, we need
    // to be running a proxy
    if (!qApp->styleSheet().isEmpty() || qt_styleSheet(parentStyle)) {
        QStyle *newStyle = parentStyle;
        if (q->testAttribute(Qt::WA_SetStyle) && qt_styleSheet(origStyle) == nullptr)
            newStyle = new QStyleSheetStyle(origStyle);
        else if (auto *styleSheetStyle = qt_styleSheet(origStyle))
            newStyle = styleSheetStyle;
        else if (QStyleSheetStyle *newProxy = qt_styleSheet(parentStyle))
            newProxy->ref();

        setStyle_helper(newStyle, true);
        return;
    }

    // So, we have no stylesheet on parent/app and we have an empty stylesheet
    // we just need our original style back
    if (origStyle == extraStyle) // is it any different?
        return;

    // We could have inherited the proxy from our parent (which has a custom style)
    // In such a case we need to start following the application style (i.e revert
    // the propagation behavior of QStyleSheetStyle)
    if (!q->testAttribute(Qt::WA_SetStyle))
        origStyle = nullptr;

    setStyle_helper(origStyle, true);
#endif // QT_NO_STYLE_STYLESHEET
}